

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

void __thiscall
QGraphicsAnchorLayoutPrivate::calculateVertexPositions
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_00;
  Data *vertex;
  AnchorVertex **ppAVar1;
  iterator iVar2;
  AnchorData *edge;
  Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *pNVar3;
  long lVar4;
  undefined1 *puVar5;
  long lVar6;
  long in_FS_OFFSET;
  AnchorVertex *copy;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> local_b8;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_a8;
  AnchorVertex *local_88;
  AnchorVertex *pAStack_80;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_78;
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> local_60;
  QArrayData *local_58;
  long lStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0;
  local_58 = (QArrayData *)0x0;
  lStack_50 = 0;
  local_60.d = (Data *)0x0;
  this_00 = (this->graph).m_data + (long)(int)orientation + -1;
  vertex = this_00[2].m_graph.d;
  vertex->seed = 0;
  local_78.d.d = (Data *)vertex;
  QHash<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>::emplace<QHashDummyValue_const&>
            ((QHash<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue> *)&local_60,
             (AnchorVertex **)&local_78,(QHashDummyValue *)&local_a8);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::adjacentVertices
            (&local_78,this_00,(AnchorVertex *)vertex);
  ppAVar1 = local_78.d.ptr;
  if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
    lVar4 = local_78.d.size << 3;
    lVar6 = 0;
    do {
      local_a8.d.ptr = *(AnchorVertex ***)((long)ppAVar1 + lVar6);
      local_a8.d.d = (Data *)vertex;
      QtPrivate::
      QPodArrayOps<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
      ::
      emplace<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>const&>
                ((QPodArrayOps<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
                  *)&local_58,local_48,
                 (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                  *)&local_a8);
      QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
      ::end((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
             *)&local_58);
      lVar6 = lVar6 + 8;
    } while (lVar4 != lVar6);
  }
  setupEdgesInterpolation(this,orientation);
  if (local_48 != 0) {
    do {
      local_88 = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
      pAStack_80 = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
      iVar2 = QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
              ::begin((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                       *)&local_58);
      local_88 = (iVar2.i)->first;
      pAStack_80 = (iVar2.i)->second;
      lStack_50 = lStack_50 + 0x10;
      local_48 = local_48 + -1;
      edge = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
             edgeData(this_00,local_88,pAStack_80);
      if ((local_60.d == (Data *)0x0) ||
         (pNVar3 = QHashPrivate::
                   Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>::
                   findNode<QtGraphicsAnchorLayout::AnchorVertex*>
                             ((Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>
                               *)local_60.d,&pAStack_80),
         pNVar3 == (Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *)0x0)) {
        local_a8.d.d = (Data *)pAStack_80;
        QHash<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>::
        emplace<QHashDummyValue_const&>
                  ((QHash<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue> *)&local_60,
                   (AnchorVertex **)&local_a8,(QHashDummyValue *)&local_b8);
        interpolateEdge(this,local_88,edge);
        local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_a8.d.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
        Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
        adjacentVertices(&local_a8,this_00,pAStack_80);
        if ((undefined1 *)local_a8.d.size != (undefined1 *)0x0) {
          lVar4 = 0;
          puVar5 = (undefined1 *)0x0;
          do {
            if ((local_60.d == (Data *)0x0) ||
               (pNVar3 = QHashPrivate::
                         Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>
                         ::findNode<QtGraphicsAnchorLayout::AnchorVertex*>
                                   ((Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>
                                     *)local_60.d,
                                    (AnchorVertex **)((long)(_func_int ***)local_a8.d.ptr + lVar4)),
               pNVar3 == (Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *)0x0)) {
              local_b8.first = pAStack_80;
              local_b8.second = *(AnchorVertex **)((long)(_func_int ***)local_a8.d.ptr + lVar4);
              QtPrivate::
              QPodArrayOps<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
              ::
              emplace<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>const&>
                        ((QPodArrayOps<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
                          *)&local_58,local_48,&local_b8);
              QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
              ::end((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                     *)&local_58);
            }
            puVar5 = puVar5 + 1;
            lVar4 = lVar4 + 8;
          } while (puVar5 < (ulong)local_a8.d.size);
        }
        if ((Data *)local_a8.d.d != (Data *)0x0) {
          LOCK();
          (((RefCount *)&(local_a8.d.d)->super_QArrayData)->atomic)._q_value.
          super___atomic_base<int>._M_i =
               (((RefCount *)&(local_a8.d.d)->super_QArrayData)->atomic)._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((RefCount *)&(local_a8.d.d)->super_QArrayData)->atomic)._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,8,0x10);
          }
        }
      }
    } while (local_48 != 0);
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,8,0x10);
    }
  }
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>::~QHash(&local_60);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::calculateVertexPositions(Qt::Orientation orientation)
{
    QQueue<std::pair<AnchorVertex *, AnchorVertex *> > queue;
    QSet<AnchorVertex *> visited;

    // Get root vertex
    AnchorVertex *root = layoutFirstVertex[orientation];

    root->distance = 0;
    visited.insert(root);

    // Add initial edges to the queue
    const auto adjacentVertices = graph[orientation].adjacentVertices(root);
    for (AnchorVertex *v : adjacentVertices)
        queue.enqueue(std::pair(root, v));

    // Do initial calculation required by "interpolateEdge()"
    setupEdgesInterpolation(orientation);

    // Traverse the graph and calculate vertex positions
    while (!queue.isEmpty()) {
        std::pair<AnchorVertex *, AnchorVertex *> pair = queue.dequeue();
        AnchorData *edge = graph[orientation].edgeData(pair.first, pair.second);

        if (visited.contains(pair.second))
            continue;

        visited.insert(pair.second);
        interpolateEdge(pair.first, edge);

        QList<AnchorVertex *> adjacents = graph[orientation].adjacentVertices(pair.second);
        for (int i = 0; i < adjacents.size(); ++i) {
            if (!visited.contains(adjacents.at(i)))
                queue.enqueue(std::pair(pair.second, adjacents.at(i)));
        }
    }
}